

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sensors_analytics_sdk.cpp
# Opt level: O0

utils * __thiscall sensors_analytics::utils::UrlDecode(utils *this,string *data)

{
  uchar uVar1;
  uchar uVar2;
  ulong uVar3;
  char *pcVar4;
  uchar *puVar5;
  uchar low;
  ulong uStack_40;
  uchar high;
  size_t i;
  size_t length;
  allocator local_1a;
  undefined1 local_19;
  string *local_18;
  string *data_local;
  string *result;
  
  local_19 = 0;
  local_18 = data;
  data_local = (string *)this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)this,"",&local_1a);
  std::allocator<char>::~allocator((allocator<char> *)&local_1a);
  uVar3 = std::__cxx11::string::length();
  for (uStack_40 = 0; uStack_40 < uVar3; uStack_40 = uStack_40 + 1) {
    pcVar4 = (char *)std::__cxx11::string::operator[]((ulong)local_18);
    if (*pcVar4 == '+') {
      std::__cxx11::string::operator+=((string *)this,' ');
    }
    else {
      pcVar4 = (char *)std::__cxx11::string::operator[]((ulong)local_18);
      if (*pcVar4 == '%') {
        puVar5 = (uchar *)std::__cxx11::string::operator[]((ulong)local_18);
        uVar1 = DecimalFromHex(*puVar5);
        uStack_40 = uStack_40 + 2;
        puVar5 = (uchar *)std::__cxx11::string::operator[]((ulong)local_18);
        uVar2 = DecimalFromHex(*puVar5);
        std::__cxx11::string::operator+=((string *)this,uVar1 * '\x10' + uVar2);
      }
      else {
        pcVar4 = (char *)std::__cxx11::string::operator[]((ulong)local_18);
        std::__cxx11::string::operator+=((string *)this,*pcVar4);
      }
    }
  }
  return this;
}

Assistant:

string UrlDecode(const string &data)
{
    std::string result = "";
    size_t length = data.length();
    for (size_t i = 0; i < length; i++)
    {
        if (data[i] == '+') result += ' ';
        else if (data[i] == '%') {
            unsigned char high = DecimalFromHex((unsigned char)data[++i]);
            unsigned char low = DecimalFromHex((unsigned char)data[++i]);
            result += high * 16 + low;
        }
        else result += data[i];
    }
    return result;
}